

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiFAQ.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  *this;
  pointer pcVar4;
  char *pcVar5;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar6;
  typed_value<bool,_char> *ptVar7;
  typed_value<unsigned_long,_char> *ptVar8;
  const_iterator cVar9;
  ostream *poVar10;
  const_iterator cVar11;
  any *paVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  long *plVar14;
  Launcher *this_00;
  undefined8 *puVar15;
  ulong *puVar16;
  size_type *psVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  element_type *peVar21;
  string outputDirectory;
  string codeGenerator;
  path pathToFiles;
  path pathToData;
  shared_ptr<Launcher> launcher;
  variables_map vm;
  options_description desc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  undefined1 local_200 [40];
  undefined1 local_1d8 [32];
  element_type *local_1b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [32];
  undefined1 local_178 [24];
  _Rb_tree_node_base local_160;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  _Hash_node_base *local_d8 [2];
  _Hash_node_base local_c8 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_b0 [24];
  void *local_98;
  undefined4 local_90;
  undefined8 local_88;
  undefined4 local_80;
  undefined8 local_78;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_70 [24];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_58;
  
  pcVar4 = local_178 + 0x10;
  local_178._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_178,"multiFAQ - allowed options","");
  boost::program_options::options_description::options_description
            ((options_description *)local_d8,(string *)local_178,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if ((pointer)local_178._0_8_ != pcVar4) {
    operator_delete((void *)local_178._0_8_);
  }
  local_260._M_dataplus._M_p = (pointer)boost::program_options::options_description::add_options();
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_260,"help,h");
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()(pcVar5,"info");
  ptVar6 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"path,p",(char *)ptVar6);
  ptVar6 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"files,f",(char *)ptVar6);
  ptVar6 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_178._0_8_ = pcVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"features.conf","");
  ptVar6 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_178);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"feat",(char *)ptVar6);
  ptVar6 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar3 = local_200 + 0x10;
  local_200._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"treedecomposition.conf","");
  ptVar6 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_200);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"td",(char *)ptVar6);
  ptVar6 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"schema.conf","");
  ptVar6 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar6,&local_220);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"schema",(char *)ptVar6);
  ptVar6 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"covar","");
  ptVar6 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar6,&local_240);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"model,m",(char *)ptVar6);
  ptVar6 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"out,o",(char *)ptVar6);
  ptVar6 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"both","");
  ptVar6 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar6,&local_280);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"parallel",(char *)ptVar6);
  ptVar7 = boost::program_options::value<bool>((bool *)0x0);
  local_198[0] = 1;
  ptVar7 = boost::program_options::typed_value<bool,_char>::default_value(ptVar7,(bool *)local_198);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"mo",(char *)ptVar7);
  ptVar7 = boost::program_options::value<bool>((bool *)0x0);
  local_1b8 = (element_type *)CONCAT71(local_1b8._1_7_,1);
  ptVar7 = boost::program_options::typed_value<bool,_char>::default_value(ptVar7,(bool *)&local_1b8)
  ;
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"compress",(char *)ptVar7);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,"microbench");
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,"bench_individual");
  ptVar8 = boost::program_options::value<unsigned_long>((unsigned_long *)0x0);
  local_1d8._0_8_ = (element_type *)0x5;
  ptVar8 = boost::program_options::typed_value<unsigned_long,_char>::default_value
                     (ptVar8,(unsigned_long *)local_1d8);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"clusters,k",(char *)ptVar8);
  ptVar8 = boost::program_options::value<unsigned_long>((unsigned_long *)0x0);
  boost::program_options::options_description_easy_init::operator()
            (pcVar5,(value_semantic *)"kappa",(char *)ptVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  if ((pointer)local_200._0_8_ != pcVar3) {
    operator_delete((void *)local_200._0_8_);
  }
  if ((pointer)local_178._0_8_ != pcVar4) {
    operator_delete((void *)local_178._0_8_);
  }
  boost::program_options::variables_map::variables_map((variables_map *)local_178);
  local_58.super_function_base.vtable = (vtable_base *)0x0;
  local_58.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_58.super_function_base.functor._8_8_ = 0;
  local_58.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_200,argc,argv,(options_description *)local_d8,0,
             &local_58);
  boost::program_options::store((basic_parsed_options *)local_200,(variables_map *)local_178,false);
  paVar1 = &local_280.field_2;
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_200);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_58);
  boost::program_options::notify((variables_map *)local_178);
  local_200._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"help","");
  this = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          *)(local_178 + 0x10);
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(this,(key_type *)local_200);
  if ((pointer)local_200._0_8_ != pcVar3) {
    operator_delete((void *)local_200._0_8_);
  }
  if (cVar9._M_node == &local_160) {
    local_200._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"info","");
    cVar11 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find(this,(key_type *)local_200);
    if ((pointer)local_200._0_8_ != pcVar3) {
      operator_delete((void *)local_200._0_8_);
    }
    if (cVar11._M_node == cVar9._M_node) {
      local_200._8_8_ = (pointer)0x0;
      local_200[0x10] = '\0';
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      local_200._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"path","");
      cVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::find(this,&local_220);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p);
      }
      if (cVar11._M_node == cVar9._M_node) {
        lVar18 = 0x49;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "You must specify a path containing the database and configuration files.\n",0x49
                  );
        pcVar5 = "Run program with --help for more information about command line options.\n";
LAB_0012b8a5:
        iVar20 = 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,lVar18);
      }
      else {
        local_280._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"path","");
        paVar12 = (any *)boost::program_options::abstract_variables_map::operator[]
                                   ((string *)local_178);
        pbVar13 = boost::any_cast<std::__cxx11::string_const&>(paVar12);
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        pcVar4 = (pbVar13->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_240,pcVar4,pcVar4 + pbVar13->_M_string_length);
        boost::filesystem::detail::current_path((error_code *)&local_260);
        boost::filesystem::detail::canonical
                  ((path *)&local_220,(path *)&local_240,(error_code *)&local_260);
        std::__cxx11::string::operator=((string *)local_200,(string *)&local_220);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p);
        }
        paVar2 = &local_260.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != paVar2) {
          operator_delete(local_260._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._M_dataplus._M_p != paVar1) {
          operator_delete(local_280._M_dataplus._M_p);
        }
        boost::filesystem::detail::status((path *)&local_220,(error_code *)local_200);
        if ((int)local_220._M_dataplus._M_p != 3) {
          lVar18 = 0x23;
          pcVar5 = "Provided path is not a directory. \n";
          goto LAB_0012b8a5;
        }
        local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
        local_220._M_string_length = 0;
        local_220.field_2._M_local_buf[0] = '\0';
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"files","");
        cVar11 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                 ::find(this,&local_240);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p);
        }
        if (cVar11._M_node == cVar9._M_node) {
          std::__cxx11::string::_M_assign((string *)&local_220);
LAB_0012b8d0:
          local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"cpp","");
          iVar20 = std::__cxx11::string::compare((char *)&local_240);
          if ((iVar20 == 0) ||
             (iVar20 = std::__cxx11::string::compare((char *)&local_240), iVar20 == 0)) {
            local_280._M_string_length = 0;
            local_280.field_2._M_allocated_capacity =
                 local_280.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_280._M_dataplus._M_p = (pointer)paVar1;
            local_260._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"out","");
            cVar11 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     ::find(this,&local_260);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != paVar2) {
              operator_delete(local_260._M_dataplus._M_p);
            }
            if (cVar11._M_node == cVar9._M_node) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1d8,"runtime/",&local_240);
              puVar15 = (undefined8 *)std::__cxx11::string::append(local_1d8);
              psVar17 = puVar15 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar15 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar17) {
                local_260.field_2._M_allocated_capacity = *psVar17;
                local_260.field_2._8_8_ = puVar15[3];
                local_260._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_260.field_2._M_allocated_capacity = *psVar17;
                local_260._M_dataplus._M_p = (pointer)*puVar15;
              }
              local_260._M_string_length = puVar15[1];
              *puVar15 = psVar17;
              puVar15[1] = 0;
              *(undefined1 *)(puVar15 + 2) = 0;
              std::__cxx11::string::operator=((string *)&local_280,(string *)&local_260);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_260._M_dataplus._M_p != paVar2) {
                operator_delete(local_260._M_dataplus._M_p);
              }
              peVar21 = (element_type *)local_1d8._0_8_;
              if ((element_type *)local_1d8._0_8_ != (element_type *)(local_1d8 + 0x10))
              goto LAB_0012baac;
            }
            else {
              local_1b8 = (element_type *)local_1a8;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"out","");
              paVar12 = (any *)boost::program_options::abstract_variables_map::operator[]
                                         ((string *)local_178);
              pbVar13 = boost::any_cast<std::__cxx11::string_const&>(paVar12);
              pcVar4 = (pbVar13->_M_dataplus)._M_p;
              local_198._0_8_ = local_198 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_198,pcVar4,pcVar4 + pbVar13->_M_string_length);
              boost::filesystem::detail::weakly_canonical((path *)local_1d8,(error_code *)local_198)
              ;
              std::operator+(&local_260,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1d8,"/");
              std::__cxx11::string::operator=((string *)&local_280,(string *)&local_260);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_260._M_dataplus._M_p != paVar2) {
                operator_delete(local_260._M_dataplus._M_p);
              }
              if ((element_type *)local_1d8._0_8_ != (element_type *)(local_1d8 + 0x10)) {
                operator_delete((void *)local_1d8._0_8_);
              }
              if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
                operator_delete((void *)local_198._0_8_);
              }
              peVar21 = local_1b8;
              if (local_1b8 != (element_type *)local_1a8) {
LAB_0012baac:
                operator_delete(peVar21);
              }
            }
            local_260._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_260,local_280._M_dataplus._M_p,
                       local_280._M_dataplus._M_p + local_280._M_string_length);
            boost::filesystem::detail::create_directories((path *)&local_260,(error_code *)0x0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != paVar2) {
              operator_delete(local_260._M_dataplus._M_p);
            }
            std::__cxx11::string::_M_assign((string *)&multifaq::dir::PATH_TO_DATA_abi_cxx11_);
            boost::filesystem::path::filename();
            std::__cxx11::string::_M_assign((string *)multifaq::dir::DATASET_NAME_abi_cxx11_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != paVar2) {
              operator_delete(local_260._M_dataplus._M_p);
            }
            std::__cxx11::string::_M_assign((string *)&multifaq::dir::PATH_TO_FILES_abi_cxx11_);
            std::__cxx11::string::_M_assign((string *)&multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_);
            this_00 = (Launcher *)operator_new(0x90);
            Launcher::Launcher(this_00);
            std::__shared_ptr<Launcher,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Launcher,void>
                      ((__shared_ptr<Launcher,(__gnu_cxx::_Lock_policy)2> *)&local_1b8,this_00);
            lVar18 = std::chrono::_V2::system_clock::now();
            iVar20 = Launcher::launch((Launcher *)local_1b8,(variables_map *)local_178);
            lVar19 = SUB168(SEXT816(lVar18) * SEXT816(-0x431bde82d7b634db),8);
            lVar18 = std::chrono::_V2::system_clock::now();
            std::__cxx11::to_string
                      ((string *)local_198,lVar18 / 1000000 + ((lVar19 >> 0x12) - (lVar19 >> 0x3f)))
            ;
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1d8,"BENCH - overall compilation time: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_198);
            plVar14 = (long *)std::__cxx11::string::append(local_1d8);
            psVar17 = (size_type *)(plVar14 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar14 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar17) {
              local_260.field_2._M_allocated_capacity = *psVar17;
              local_260.field_2._8_8_ = plVar14[3];
              local_260._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_260.field_2._M_allocated_capacity = *psVar17;
              local_260._M_dataplus._M_p = (pointer)*plVar14;
            }
            local_260._M_string_length = plVar14[1];
            *plVar14 = (long)psVar17;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,local_260._M_dataplus._M_p,local_260._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != paVar2) {
              operator_delete(local_260._M_dataplus._M_p);
            }
            if ((element_type *)local_1d8._0_8_ != (element_type *)(local_1d8 + 0x10)) {
              operator_delete((void *)local_1d8._0_8_);
            }
            if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
              operator_delete((void *)local_198._0_8_);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"----------------------------------------",0x28);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"The generated code was output to: ",0x22);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,local_280._M_dataplus._M_p,
                                 local_280._M_string_length);
            std::endl<char,std::char_traits<char>>(poVar10);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Run the following commands to execute code: ",0x2c);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   cd ",6);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,local_280._M_dataplus._M_p,
                                 local_280._M_string_length);
            std::endl<char,std::char_traits<char>>(poVar10);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"   make -j ",0xb);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"   ./lmfao ",0xb);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            if (local_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280._M_dataplus._M_p != &local_280.field_2) {
              operator_delete(local_280._M_dataplus._M_p);
            }
          }
          else {
            std::operator+(&local_260,"The code generator ",&local_240);
            plVar14 = (long *)std::__cxx11::string::append((char *)&local_260);
            puVar16 = (ulong *)(plVar14 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar14 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar16) {
              local_280.field_2._M_allocated_capacity = *puVar16;
              local_280.field_2._8_8_ = plVar14[3];
              local_280._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_280.field_2._M_allocated_capacity = *puVar16;
              local_280._M_dataplus._M_p = (pointer)*plVar14;
            }
            local_280._M_string_length = plVar14[1];
            *plVar14 = (long)puVar16;
            plVar14[1] = 0;
            *(undefined1 *)(plVar14 + 2) = 0;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,local_280._M_dataplus._M_p,local_280._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_280._M_dataplus._M_p != paVar1) {
              operator_delete(local_280._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != paVar2) {
              operator_delete(local_260._M_dataplus._M_p);
            }
            iVar20 = 1;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_dataplus._M_p != &local_240.field_2) {
            operator_delete(local_240._M_dataplus._M_p);
          }
        }
        else {
          local_260._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"files","");
          paVar12 = (any *)boost::program_options::abstract_variables_map::operator[]
                                     ((string *)local_178);
          pbVar13 = boost::any_cast<std::__cxx11::string_const&>(paVar12);
          pcVar4 = (pbVar13->_M_dataplus)._M_p;
          local_280._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_280,pcVar4,pcVar4 + pbVar13->_M_string_length);
          boost::filesystem::detail::current_path((error_code *)local_1d8);
          boost::filesystem::detail::canonical
                    ((path *)&local_240,(path *)&local_280,(error_code *)local_1d8);
          std::__cxx11::string::operator=((string *)&local_220,(string *)&local_240);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_dataplus._M_p != &local_240.field_2) {
            operator_delete(local_240._M_dataplus._M_p);
          }
          if ((element_type *)local_1d8._0_8_ != (element_type *)(local_1d8 + 0x10)) {
            operator_delete((void *)local_1d8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_dataplus._M_p != paVar1) {
            operator_delete(local_280._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != paVar2) {
            operator_delete(local_260._M_dataplus._M_p);
          }
          boost::filesystem::detail::status((path *)&local_240,(error_code *)&local_220);
          if ((int)local_240._M_dataplus._M_p == 3) goto LAB_0012b8d0;
          iVar20 = 1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Provided path to files is not a directory. \n",0x2c);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p);
        }
      }
      if ((pointer)local_200._0_8_ != pcVar3) {
        operator_delete((void *)local_200._0_8_);
      }
      goto LAB_0012b4f9;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"LMFAO - 0.1 Edition\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Compiled on ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Apr 26 2025",0xb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," at ",4);
    poVar10 = (ostream *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"19:40:14",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".\n",2);
    lVar18 = 0x17;
    pcVar5 = "Build type: Benchmark.\n";
  }
  else {
    poVar10 = (ostream *)
              boost::program_options::operator<<
                        ((ostream *)&std::cout,(options_description *)local_d8);
    lVar18 = 1;
    pcVar5 = "\n";
  }
  iVar20 = 0;
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar5,lVar18);
LAB_0012b4f9:
  local_178._0_8_ = std::ios::clear;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_108);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_138);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree(this);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_70);
  if (local_98 != (void *)0x0) {
    operator_delete(local_98);
    local_98 = (void *)0x0;
    local_90 = 0;
    local_88 = 0;
    local_80 = 0;
    local_78 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_b0);
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0]);
  }
  return iVar20;
}

Assistant:

int main(int argc, char *argv[])
{
   /* Object containing a description of all the options available in the
      program. */
   boost::program_options::options_description desc("multiFAQ - allowed options");
   desc.add_options()
       /* Option to show help. */
       ("help,h", "produce help message.")
       /* Option to show some info. */
       ("info", "show some information about the program.")
       /* Option for path to data and configuration files. */
       ("path,p", boost::program_options::value<std::string>(),
        "set path for data and configuration files - required.")
       /* Option for path to data and configuration files. */
       ("files,f", boost::program_options::value<std::string>(),
        "set path for config files - if different from path to data.")     
       /* Option for feature config file. */
       ("feat", boost::program_options::value<std::string>()->
        default_value("features.conf"),
        "features file for this model, assumed to be in pathToFiles")
       /* Option for treedecomposition config file. */
       ("td", boost::program_options::value<std::string>()->
        default_value("treedecomposition.conf"),
        "tree decomposition config file, assumed to be in pathToFiles")
       /* Option for treedecomposition config file. */
       ("schema", boost::program_options::value<std::string>()->
        default_value("schema.conf"),
        "schmea config file, assumed to be in pathToFiles")
       /* Option for machine learning model. */
       ("model,m", boost::program_options::value<std::string>()->default_value("covar"),
        "model to be computed: reg, covar (default), ctree, rtree, cube, mi, or perc")
       /* Option for code generator. */
       // ("codegen,g", boost::program_options::value<std::string>()->default_value("cpp"),
       //  "open for code generation: cpp (default), or sql")
       /* Option for directory of generated code. */
       ("out,o",boost::program_options::value<std::string>(),
        "output directory for the generated code, default: runtime/cpp/")
       /* Option for parallellization. */
       ("parallel", boost::program_options::value<std::string>()->default_value("both"),
        "options for parallelization: none, task, domain, or both (default)")
       /* Option to turn off mutlti output operator. */
       ("mo", boost::program_options::value<bool>()->default_value("1"),
        "turn multioutput operator on (default)/off")
       /* Option to turn off compression of aggregates operator. */
       ("compress", boost::program_options::value<bool>()->default_value("1"),
        "turn compression of aggregates on (default)/off")
       /* Option to turn off mutlti output operator. */
       // ("resort", "enables resorting of views / relations, requires multiout off.")
       /* Option to turn off mutlti output operator. */
       ("microbench", "enables micro benchmarking.")
       /* Option to turn off mutlti output operator. */
       ("bench_individual", "enables benchmarking for each group individually.")
       ("clusters,k", boost::program_options::value<size_t>()->default_value(5),
        "k for k-means algorithm. (Default = 5).")
       ("kappa", boost::program_options::value<size_t>(),
        "kappa for k-means algorithm. (Default = k).");
       /* Option for parallellization. */
       // ("degree", boost::program_options::value<int>()->default_value(1),
       //  "Degree of interactions for regression models and FMs. (Default = 1).");


   /* Register previous options and do command line parsing. */
   boost::program_options::variables_map vm;
   boost::program_options::store(
       boost::program_options::parse_command_line(argc, argv, desc), vm);
   boost::program_options::notify(vm);

   /* Display help. */
   if (vm.count("help"))
   {
      std::cout << desc << "\n";
      return EXIT_SUCCESS;
   }

   /* Display info. */
   if (vm.count("info"))
   {
      std::cout << "LMFAO - 0.1 Edition\n";
      std::cout << "Compiled on " << __DATE__ << " at " << __TIME__ << ".\n";
#ifdef BENCH
      std::cout << "Build type: Benchmark.\n";
#elif defined NDEBUG
      std::cout << "Build type: Release.\n";
#else
      std::cout << "Build type: Debug.\n";
#endif
      return EXIT_SUCCESS;
   }

   
   boost::filesystem::path pathToData;
   
   /* Retrieve compulsory path. */
   if (vm.count("path"))
   {
       
       pathToData = boost::filesystem::canonical(vm["path"].as<std::string>());

       /*If provided path is not a directory, return failure. */
       if (!boost::filesystem::is_directory(pathToData))
       {
           ERROR("Provided path is not a directory. \n");
           return EXIT_FAILURE;
       }
   }
   else
   {
      ERROR(
         "You must specify a path containing the database and configuration files.\n" <<
         "Run program with --help for more information about command line options.\n");
      return EXIT_FAILURE;
   }   

   boost::filesystem::path pathToFiles;

   /* Retrieve path to files. */
   if (vm.count("files"))
   {
       pathToFiles = boost::filesystem::canonical(vm["files"].as<std::string>());

       /*If provided path is not a directory, return failure. */
       if (!boost::filesystem::is_directory(pathToFiles))
       {
           ERROR("Provided path to files is not a directory. \n");
           return EXIT_FAILURE;
       }
   }
   else
   {
       pathToFiles = pathToData;
   }   

   /* Check the code generator is supported */
   std::string codeGenerator =  "cpp"; // vm["codegen"].as<std::string>();

   if (codeGenerator.compare("cpp") != 0 && codeGenerator.compare("sql") != 0)
   {
       ERROR("The code generator "+codeGenerator+" is not supported. \n");
       return EXIT_FAILURE;
   }


   /* Set the path for outDirectory */
   std::string outputDirectory;
   if (vm.count("out"))
       outputDirectory = boost::filesystem::weakly_canonical(
           vm["out"].as<std::string>()).string()+"/";
   else
       outputDirectory = "runtime/"+codeGenerator+"/";
   
   /*If provided path is not a directory, create it. */
   if (boost::filesystem::create_directories(outputDirectory))
   {   
       DINFO("INFO: Output directory " << outputDirectory << " created." << std::endl);
   }
   else
   {    
       DINFO("INFO: Output directory " << outputDirectory << " exists." << std::endl);
   }
   
           
   /* Setting global parameters for directories */
   multifaq::dir::PATH_TO_DATA = pathToData.string();
   multifaq::dir::DATASET_NAME = pathToData.filename().string();
   multifaq::dir::PATH_TO_FILES = pathToFiles.string();
   multifaq::dir::OUTPUT_DIRECTORY = outputDirectory;


   /* Create and run Launcher */
   std::shared_ptr<Launcher> launcher(new Launcher());

#ifdef BENCH
   int64_t start = std::chrono::duration_cast<std::chrono::milliseconds>(
       std::chrono::system_clock::now().time_since_epoch()).count();
#endif

   /* Launch program. */
   int result = launcher->launch(vm);

#ifdef BENCH
   int64_t end = std::chrono::duration_cast<std::chrono::milliseconds>(
       std::chrono::system_clock::now().time_since_epoch()).count() - start;
#endif

   BINFO("BENCH - overall compilation time: " + std::to_string(end) + "ms.\n");
   DINFO("INFO: Completed execution \n");
   
   std::cout << "----------------------------------------" << std::endl;
   std::cout << "The generated code was output to: " << outputDirectory << std::endl;
   std::cout << "Run the following commands to execute code: "  << std::endl;
   std::cout << "   cd " << outputDirectory << std::endl;
   std::cout << "   make -j " << std::endl;
   std::cout << "   ./lmfao " << std::endl;
   
   return result;
}